

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpParserTestCase.cpp
# Opt level: O0

void __thiscall
SuiteHttpParserTests::TestreadHttpMessageFixturereadHttpMessage::
TestreadHttpMessageFixturereadHttpMessage(TestreadHttpMessageFixturereadHttpMessage *this)

{
  char *suiteName;
  TestreadHttpMessageFixturereadHttpMessage *this_local;
  
  suiteName = SuiteHttpParserTests::UnitTestSuite::GetSuiteName();
  UnitTest::Test::Test
            (&this->super_Test,"readHttpMessage",suiteName,
             "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/test/HttpParserTestCase.cpp"
             ,0x36);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__TestreadHttpMessageFixturereadHttpMessage_00458470;
  return;
}

Assistant:

TEST_FIXTURE(readHttpMessageFixture, readHttpMessage)
{
  std::string readHttpMsg;
  CHECK( object.readHttpMessage( readHttpMsg ) );
  CHECK_EQUAL( httpMsg1, readHttpMsg );

  CHECK( object.readHttpMessage( readHttpMsg ) );
  CHECK_EQUAL( httpMsg2, readHttpMsg );

  CHECK( object.readHttpMessage( readHttpMsg ) );
  CHECK_EQUAL( httpMsg3, readHttpMsg );
}